

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall Matrix::Matrix(Matrix *this,int nx,int ny)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  ulong uVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong __new_size;
  ulong uVar9;
  
  this_00 = &this->col_inds;
  this_01 = &this->values;
  uVar10 = ny * nx;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->row_ptrs,(long)(int)(uVar10 + 1));
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)(uVar10 * 5));
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)(int)(uVar10 * 5));
  piVar2 = (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar2 = 0;
  __new_size = 0;
  if (0 < (int)uVar10) {
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      iVar15 = (int)__new_size;
      iVar8 = (int)uVar9;
      iVar11 = (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) % (long)nx);
      uVar1 = uVar9 + 1;
      iVar13 = (int)uVar1;
      if (iVar11 == nx + -1) {
        iVar13 = -1;
      }
      iVar6 = (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)nx);
      iVar5 = nx + iVar8;
      if (iVar6 == ny + -1) {
        iVar5 = -1;
      }
      iVar14 = iVar15;
      if ((iVar6 != 0) && (iVar8 - nx != -1)) {
        piVar3[iVar15] = iVar8 - nx;
        iVar14 = iVar15 + 1;
        pdVar4[iVar15] = -1.0;
      }
      uVar12 = -(uint)(iVar11 == 0) | iVar8 - 1U;
      iVar15 = iVar14;
      if (uVar12 != 0xffffffff) {
        piVar3[iVar14] = uVar12;
        iVar15 = iVar14 + 1;
        pdVar4[iVar14] = -1.0;
      }
      uVar7 = iVar15 + 1;
      piVar3[iVar15] = iVar8;
      pdVar4[iVar15] = 4.0;
      uVar12 = uVar7;
      if (iVar11 != nx + -1) {
        piVar3[(int)uVar7] = iVar13;
        uVar12 = iVar15 + 2;
        pdVar4[(int)uVar7] = -1.0;
      }
      if (iVar5 != -1) {
        piVar3[(int)uVar12] = iVar5;
        pdVar4[(int)uVar12] = -1.0;
        uVar12 = uVar12 + 1;
      }
      __new_size = (ulong)uVar12;
      piVar2[uVar9 + 1] = uVar12;
      uVar9 = uVar1;
    } while (uVar1 != uVar10);
    __new_size = (ulong)(int)uVar12;
  }
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
  return;
}

Assistant:

Matrix::Matrix(int nx, int ny) {
    int num_rows = nx*ny;
    int nnz_est  = 5*num_rows;

    row_ptrs.resize(num_rows+1);
    col_inds.resize(nnz_est);
    values  .resize(nnz_est);

    int center, left, right, lower, upper, ind = 0;

    row_ptrs[0] = 0;
    for (int i = 0; i < num_rows; i++) {
        center = i;

        get_2d_neighbors(center, nx, ny, left, right, lower, upper);

        if (lower != -1) { col_inds[ind] = lower; values[ind++] = -1; }
        if (left  != -1) { col_inds[ind] = left;  values[ind++] = -1; }

        col_inds[ind] = center; values[ind++] = 4;

        if (right != -1) { col_inds[ind] = right; values[ind++] = -1; }
        if (upper != -1) { col_inds[ind] = upper; values[ind++] = -1; }

        row_ptrs[i+1] = ind;
    }
    col_inds.resize(ind);
    values  .resize(ind);
}